

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O0

void helper_aeskeygenassist_xmm_x86_64(CPUX86State *env,ZMMReg *d,ZMMReg *s,uint32_t ctrl)

{
  byte local_68 [4];
  byte abStack_64 [4];
  ZMMReg tmp;
  int i;
  uint32_t ctrl_local;
  ZMMReg *s_local;
  ZMMReg *d_local;
  CPUX86State *env_local;
  
  tmp._l_ZMMReg[0xf] = ctrl;
  _i = s;
  s_local = d;
  d_local = (ZMMReg *)env;
  memcpy(local_68,s,0x40);
  for (tmp._l_ZMMReg[0xe] = 0; (int)tmp._l_ZMMReg[0xe] < 4;
      tmp._l_ZMMReg[0xe] = tmp._l_ZMMReg[0xe] + 1) {
    s_local->_b_ZMMReg[(int)tmp._l_ZMMReg[0xe]] = AES_sbox[local_68[(int)(tmp._l_ZMMReg[0xe] + 4)]];
    s_local->_b_ZMMReg[(int)(tmp._l_ZMMReg[0xe] + 8)] =
         AES_sbox[local_68[(int)(tmp._l_ZMMReg[0xe] + 0xc)]];
  }
  s_local->_l_ZMMReg[1] =
       (s_local->_l_ZMMReg[0] << 0x18 | s_local->_l_ZMMReg[0] >> 8) ^ tmp._l_ZMMReg[0xf];
  s_local->_l_ZMMReg[3] =
       (s_local->_l_ZMMReg[2] << 0x18 | s_local->_l_ZMMReg[2] >> 8) ^ tmp._l_ZMMReg[0xf];
  return;
}

Assistant:

void glue(helper_aeskeygenassist, SUFFIX)(CPUX86State *env, Reg *d, Reg *s,
                                          uint32_t ctrl)
{
    int i;
    Reg tmp = *s;

    for (i = 0 ; i < 4 ; i++) {
        d->B(i) = AES_sbox[tmp.B(i + 4)];
        d->B(i + 8) = AES_sbox[tmp.B(i + 12)];
    }
    d->L(1) = (d->L(0) << 24 | d->L(0) >> 8) ^ ctrl;
    d->L(3) = (d->L(2) << 24 | d->L(2) >> 8) ^ ctrl;
}